

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  function_type *function_pointer;
  int local_55c;
  code *local_558;
  undefined8 local_550;
  shared_ptr<object> local_548;
  undefined1 local_538 [8];
  fn m;
  int local_4dc;
  code *local_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8 [8];
  fn l;
  object local_46d;
  int local_46c;
  undefined1 local_468 [3];
  object l_init;
  undefined1 local_458 [8];
  fn k;
  int local_3fc;
  undefined1 local_3f8 [8];
  fn j;
  functor j_init;
  anon_class_8_1_54a39807_for_m_object aStack_3a0;
  undefined1 local_398 [8];
  fn i;
  int local_340;
  __1 local_339;
  undefined1 local_338 [8];
  fn h;
  int local_2e0;
  anon_class_1_0_00000001_for_m_object local_2d9;
  undefined1 local_2d8 [8];
  fn g;
  int local_27c;
  undefined1 local_278 [8];
  fn f;
  int local_21c;
  undefined1 local_218 [8];
  fn e;
  int local_1bc;
  code *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [8];
  fn d;
  object d_init;
  object local_139;
  undefined1 local_138 [8];
  fn c;
  int local_dc;
  undefined1 local_d8 [8];
  fn b;
  functor local_7d [8];
  functor b_init;
  int local_70;
  functor local_69;
  undefined1 local_68 [8];
  fn a;
  uint local_10;
  int lvalue;
  int failures;
  
  a.m_storage._28_4_ = 0;
  tmf::callable<int_(int_&,_int),_32UL>::callable<functor>
            ((callable<int_(int_&,_int),_32UL> *)local_68,&local_69);
  local_70 = 1;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_68,(int *)(a.m_storage.__data + 0x1c),
                     &local_70);
  if (iVar1 != 1) {
    std::operator<<((ostream *)&std::cout,"call test: step 1 failed!\n");
  }
  local_10 = (uint)(iVar1 != 1);
  local_7d[0] = (functor)0x0;
  tmf::callable<int(int&,int),32ul>::callable<functor&>
            ((callable<int(int&,int),32ul> *)local_d8,local_7d);
  local_dc = 2;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_d8,(int *)(a.m_storage.__data + 0x1c),
                     &local_dc);
  if (iVar1 != 2) {
    std::operator<<((ostream *)&std::cout,"call test: step 2 failed!\n");
    local_10 = local_10 + 1;
  }
  tmf::callable<int(int&,int),32ul>::callable<object,int(object::*)(int&,int)>
            ((callable<int(int&,int),32ul> *)local_138,&local_139,0x103900);
  d.m_storage._28_4_ = 3;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_138,(int *)(a.m_storage.__data + 0x1c),
                     (int *)(d.m_storage.__data + 0x1c));
  if (iVar1 != 3) {
    std::operator<<((ostream *)&std::cout,"call test: step 3 failed!\n");
    local_10 = local_10 + 1;
  }
  d.m_storage.__data[0x1b] = '\0';
  local_1b8 = object::method;
  local_1b0 = 0;
  tmf::callable<int(int&,int),32ul>::callable<object&,int(object::*)(int&,int)>
            ((callable<int(int&,int),32ul> *)local_1a8,(object *)(d.m_storage.__data + 0x1b),
             0x103900);
  local_1bc = 4;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_1a8,(int *)(a.m_storage.__data + 0x1c),
                     &local_1bc);
  if (iVar1 != 4) {
    std::operator<<((ostream *)&std::cout,"call test: step 4 failed!\n");
    local_10 = local_10 + 1;
  }
  tmf::callable<int_(int_&,_int),_32UL>::callable
            ((callable<int_(int_&,_int),_32UL> *)local_218,free_function);
  local_21c = 5;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_218,(int *)(a.m_storage.__data + 0x1c),
                     &local_21c);
  if (iVar1 != 5) {
    std::operator<<((ostream *)&std::cout,"call test: step 5 failed!\n");
    local_10 = local_10 + 1;
  }
  tmf::callable<int_(int_&,_int),_32UL>::callable
            ((callable<int_(int_&,_int),_32UL> *)local_278,object::static_method);
  local_27c = 6;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_278,(int *)(a.m_storage.__data + 0x1c),
                     &local_27c);
  if (iVar1 != 6) {
    std::operator<<((ostream *)&std::cout,"call test: step 6 failed!\n");
    local_10 = local_10 + 1;
  }
  tmf::callable<int(int&,int),32ul>::callable<main::__0>
            ((callable<int(int&,int),32ul> *)local_2d8,&local_2d9);
  local_2e0 = 7;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_2d8,(int *)(a.m_storage.__data + 0x1c),
                     &local_2e0);
  if (iVar1 != 7) {
    std::operator<<((ostream *)&std::cout,"call test: step 7 failed!\n");
    local_10 = local_10 + 1;
  }
  function_pointer = main::$_1::operator_cast_to_function_pointer(&local_339);
  tmf::callable<int_(int_&,_int),_32UL>::callable
            ((callable<int_(int_&,_int),_32UL> *)local_338,function_pointer);
  local_340 = 8;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_338,(int *)(a.m_storage.__data + 0x1c),
                     &local_340);
  if (iVar1 != 8) {
    std::operator<<((ostream *)&std::cout,"call test: step 8 failed!\n");
    local_10 = local_10 + 1;
  }
  aStack_3a0.g = (fn *)local_2d8;
  tmf::callable<int(int&,int),32ul>::callable<main::__2>
            ((callable<int(int&,int),32ul> *)local_398,&stack0xfffffffffffffc60);
  j.m_storage._28_4_ = 9;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_398,(int *)(a.m_storage.__data + 0x1c),
                     (int *)(j.m_storage.__data + 0x1c));
  if (iVar1 != 9) {
    std::operator<<((ostream *)&std::cout,"call test: step 9 failed!\n");
    local_10 = local_10 + 1;
  }
  tmf::callable<int_(int_&,_int),_32UL>::callable<functor>
            ((callable<int_(int_&,_int),_32UL> *)local_3f8,(functor *)(j.m_storage.__data + 0x1b));
  local_3fc = 10;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_3f8,(int *)(a.m_storage.__data + 0x1c),
                     &local_3fc);
  if (iVar1 != 10) {
    std::operator<<((ostream *)&std::cout,"call test: step 10 failed!\n");
    local_10 = local_10 + 1;
  }
  std::make_shared<functor>();
  tmf::callable<int_(int_&,_int),_32UL>::callable<functor>
            ((callable<int_(int_&,_int),_32UL> *)local_458,(shared_ptr<functor> *)local_468);
  std::shared_ptr<functor>::~shared_ptr((shared_ptr<functor> *)local_468);
  local_46c = 0xb;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_458,(int *)(a.m_storage.__data + 0x1c),
                     &local_46c);
  if (iVar1 != 0xb) {
    std::operator<<((ostream *)&std::cout,"call test: step 11 failed!\n");
    local_10 = local_10 + 1;
  }
  local_4d8 = object::method;
  local_4d0 = 0;
  tmf::callable<int(int&,int),32ul>::callable<object,int(object::*)(int&,int)>
            ((callable<int(int&,int),32ul> *)local_4c8,&local_46d,0x103900);
  local_4dc = 0xc;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_4c8,(int *)(a.m_storage.__data + 0x1c),
                     &local_4dc);
  if (iVar1 != 0xc) {
    std::operator<<((ostream *)&std::cout,"call test: step 12 failed!\n");
    local_10 = local_10 + 1;
  }
  std::make_shared<object>();
  local_558 = object::method;
  local_550 = 0;
  tmf::callable<int(int&,int),32ul>::callable<object,int(object::*)(int&,int)>
            ((callable<int(int&,int),32ul> *)local_538,&local_548,0x103900);
  std::shared_ptr<object>::~shared_ptr(&local_548);
  local_55c = 0xd;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)local_538,(int *)(a.m_storage.__data + 0x1c),
                     &local_55c);
  if (iVar1 != 0xd) {
    std::operator<<((ostream *)&std::cout,"call test: step 13 failed!\n");
    local_10 = local_10 + 1;
  }
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_538);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_4c8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_458);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_3f8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_398);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_338);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_2d8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_278);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_218);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_1a8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_138);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_d8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_68);
  return local_10;
}

Assistant:

int
main()
{
		using fn = tmf::callable<int(int&, int)>;
		int failures = 0;
		int lvalue = 0;

		// to initialize with a functor, provide a class instance
		// - you can provide an rvalue to have your instance possibly moved into the callable
		fn a{ functor{} };
		a(lvalue, 1) == 1 ? 0 : (std::cout << "call test: step 1 failed!\n", ++failures);

		// - you can provide an lvalue to have your instance copied into the callable
		functor b_init{};
		fn b{ b_init };
		b(lvalue, 2) == 2 ? 0 : (std::cout << "call test: step 2 failed!\n", ++failures);

		// to initialize with an arbitrary member function provide a class instance
		// and a pointer to member function
		// - you can provide an rvalue to have your instance possibly moved into the callable
		fn c{ object{}, &object::method };
		c(lvalue, 3) == 3 ? 0 : (std::cout << "call test: step 3 failed!\n", ++failures);

		// - you can provide an lvalue to have your instance copied into the callable
		object d_init{};
		fn d{ d_init, &object::method };
		d(lvalue, 4) == 4 ? 0 : (std::cout << "call test: step 4 failed!\n", ++failures);

		// to initialize with a free function, provide the address of a
		// free function or static member function
		fn e{ &free_function };
		e(lvalue, 5) == 5 ? 0 : (std::cout << "call test: step 5 failed!\n", ++failures);

		fn f{ &object::static_method };
		f(lvalue, 6) == 6 ? 0 : (std::cout << "call test: step 6 failed!\n", ++failures);

		// to initialize with a lambda, simply provide the lambda
		fn g{ [](int& out, int i) { out += 1; return i; } };
		g(lvalue, 7) == 7 ? 0 : (std::cout << "call test: step 7 failed!\n", ++failures);

		// if the lambda can be downcast to a function pointer, this can reduce the size of the stored callable
		fn h{ static_cast<int(*)(int&, int)>([](int& out, int i) { out += 1; return i; }) };
		h(lvalue, 8) == 8 ? 0 : (std::cout << "call test: step 8 failed!\n", ++failures);

		// lambdas can capture, but keep in mind how this might effect the size of the callable
		fn i{ [&g](int& out, int value) { return g(out, value); } };
		i(lvalue, 9) == 9 ? 0 : (std::cout << "call test: step 9 failed!\n", ++failures);

		// initialize with a raw pointer to avoid copies and moves
		functor j_init;
		fn j{ &j_init };
		j(lvalue, 10) == 10 ? 0 : (std::cout << "call test: step 10 failed!\n", ++failures);

		// shared_ptr is a safer way to avoid copies and moves
		fn k{ std::make_shared<functor>() };
		k(lvalue, 11) == 11 ? 0 : (std::cout << "call test: step 11 failed!\n", ++failures);

		// initialize with a raw pointer to avoid copies and moves
		object l_init;
		fn l{ &l_init, &object::method };
		l(lvalue, 12) == 12 ? 0 : (std::cout << "call test: step 12 failed!\n", ++failures);

		// shared_ptr is a safer way to avoid copies and moves
		fn m{ std::make_shared<object>(), &object::method };
		m(lvalue, 13) == 13 ? 0 : (std::cout << "call test: step 13 failed!\n", ++failures);

		return failures;
}